

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O0

size_t spvtools::utils::CountSetBits<unsigned_int>(uint word)

{
  undefined4 local_10;
  undefined4 local_c;
  uint32_t count;
  uint word_local;
  
  local_10 = 0;
  for (local_c = word; local_c != 0; local_c = local_c - 1 & local_c) {
    local_10 = local_10 + 1;
  }
  return (ulong)local_10;
}

Assistant:

size_t CountSetBits(T word) {
  static_assert(std::is_integral<T>::value,
                "CountSetBits requires integer type");
  uint32_t count = 0;
  while (word) {
    word &= word - 1;
    ++count;
  }
  return count;
}